

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::bufferData
          (ReferenceContext *this,deUint32 target,deIntptr size,void *data,deUint32 usage)

{
  bool bVar1;
  deBool dVar2;
  DataBuffer *this_00;
  deUint8 *dst;
  DataBuffer *buffer;
  deUint32 usage_local;
  void *data_local;
  deIntptr size_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  do {
    bVar1 = isValidBufferTarget(target);
    if (!bVar1) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    if (size < 0) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  this_00 = getBufferBinding(this,target);
  do {
    if (this_00 == (DataBuffer *)0x0) {
      setError(this,0x502);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  rc::DataBuffer::setStorage(this_00,(int)size);
  if (data != (void *)0x0) {
    dst = rc::DataBuffer::getData(this_00);
    ::deMemcpy(dst,data,(long)(int)size);
  }
  return;
}

Assistant:

void ReferenceContext::bufferData (deUint32 target, deIntptr size, const void* data, deUint32 usage)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(size < 0, GL_INVALID_VALUE, RC_RET_VOID);

	DE_UNREF(usage);

	DataBuffer* buffer = getBufferBinding(target);
	RC_IF_ERROR(!buffer, GL_INVALID_OPERATION, RC_RET_VOID);

	DE_ASSERT((deIntptr)(int)size == size);
	buffer->setStorage((int)size);
	if (data)
		deMemcpy(buffer->getData(), data, (int)size);
}